

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.h
# Opt level: O0

int __thiscall s_i::peek(s_i *this,size_t n)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  char *local_28;
  char *p;
  size_t n_local;
  s_i *this_local;
  
  p = (char *)n;
  n_local = (size_t)this;
  if ((this->utf8 & 1U) == 0) {
    sVar2 = ind(this);
    uVar3 = std::__cxx11::string::size();
    if (n + sVar2 < uVar3) {
      this_local._4_4_ = (int)this->i[(long)p];
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  else {
    local_28 = this->i;
    while (p != (char *)0x0) {
      p = p + -1;
      bVar1 = atEnd(this);
      if (bVar1) {
        return -1;
      }
      read_UTF8_ch(&local_28);
    }
    p = p + -1;
    bVar1 = atEnd(this);
    if (bVar1) {
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = read_UTF8_ch(local_28);
    }
  }
  return this_local._4_4_;
}

Assistant:

int peek(size_t n = 0) {
        if (utf8) {
            const char* p = i;
            while (n--) {
                if (atEnd())
                    return -1;
                read_UTF8_ch(&p);
            }
            if (atEnd())
                return -1;
            return read_UTF8_ch(p);
        } else {
            if (n + ind() >= s.size()) return -1;
            return i[n];
        }
    }